

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebugStateSaver::QDebugStateSaver(QDebugStateSaver *this,QDebug *dbg)

{
  QDebugStateSaverPrivate *in_RDI;
  Stream *in_stack_ffffffffffffffc8;
  
  operator_new(0x30);
  QDebugStateSaverPrivate::QDebugStateSaverPrivate(in_RDI,in_stack_ffffffffffffffc8);
  std::unique_ptr<QDebugStateSaverPrivate,std::default_delete<QDebugStateSaverPrivate>>::
  unique_ptr<std::default_delete<QDebugStateSaverPrivate>,void>
            ((unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_> *)
             in_RDI,(pointer)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

QDebugStateSaver::QDebugStateSaver(QDebug &dbg)
    : d(new QDebugStateSaverPrivate(dbg.stream))
{
}